

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_unix_socket_address.c
# Opt level: O2

void test_init_uds_socket_address_path_too_long(void)

{
  cio_error cVar1;
  cio_socket_address address;
  char path [1000];
  
  memset(path,0x68,1000);
  path[999] = '\0';
  cVar1 = cio_init_uds_socket_address(&address,path);
  UnityAssertEqualNumber
            (-0x16,(long)cVar1,
             "initialization of uds socket address didn\'t fail when path is too long",0x54,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_init_uds_socket_address_path_too_long(void)
{
	char path[1000];
	memset(path, 'h', sizeof(path));
	path[1000 - 1] = '\0';
	struct cio_socket_address address;
	enum cio_error err = cio_init_uds_socket_address(&address, path);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "initialization of uds socket address didn't fail when path is too long");
}